

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O0

int av1_get_cb_rdmult(AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int mi_row,int mi_col)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int in_ECX;
  byte in_DL;
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  double dVar12;
  double dVar13;
  double dVar14;
  double rk;
  double dist_scaled;
  int64_t mc_dep_delta;
  double cbcmp;
  TplDepStats *this_stats;
  int col;
  int row;
  int step;
  double cbcmp_base;
  double mc_dep_cost_base;
  double intra_cost_base;
  int tpl_stride;
  int mi_high;
  int mi_wide;
  TplDepStats *tpl_stats;
  TplDepFrame *tpl_frame;
  TplParams *tpl_data;
  int deltaq_rdmult;
  int tpl_idx;
  AV1_COMMON *cm;
  int local_bc;
  int local_84;
  int local_80;
  double local_78;
  double local_70;
  double local_68;
  int in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AV1_COMP *in_stack_ffffffffffffffb0;
  long lVar15;
  int local_4;
  
  bVar1 = *(byte *)(in_RDI + 0xe258);
  local_4 = set_rdmult(in_stack_ffffffffffffffb0,
                       (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                       in_stack_ffffffffffffffa4);
  iVar5 = av1_tpl_stats_ready((TplParams *)(*in_RDI + 0xd2a8),(uint)bVar1);
  if ((((iVar5 != 0) && ((char)in_RDI[0x77fa] == '\b')) && ((char)in_RDI[0x8480] == '\0')) &&
     ((*(double *)(in_RSI + 0x4220) != 0.0 || (NAN(*(double *)(in_RSI + 0x4220)))))) {
    lVar2 = *in_RDI;
    lVar10 = *(long *)(lVar2 + 0x12298) + (long)(int)(uint)bVar1 * 0x60;
    lVar11 = *(long *)(lVar10 + 8);
    uVar6 = (uint)"\x01\x01\x02\x02\x02\x04\x04\x04\b\b\b\x10\x10\x10  \x01\x04\x02\b\x04\x10"
                  [in_DL];
    uVar7 = (uint)"\x01\x02\x01\x02\x04\x02\x04\b\x04\b\x10\b\x10 \x10 \x04\x01\b\x02\x10\x04"
                  [in_DL];
    iVar5 = *(int *)(lVar10 + 0x40);
    local_68 = 0.0;
    local_70 = 0.0;
    local_78 = 0.0;
    iVar8 = 1 << (*(byte *)(lVar2 + 0xd2ac) & 0x1f);
    for (local_80 = in_ECX; local_84 = in_R8D, local_80 < (int)(in_ECX + uVar7);
        local_80 = iVar8 + local_80) {
      for (; local_84 < (int)(in_R8D + uVar6); local_84 = iVar8 + local_84) {
        if ((local_80 < *(int *)((long)in_RDI + 0x3c194)) && (local_84 < (int)in_RDI[0x7833])) {
          lVar15 = lVar11;
          iVar9 = av1_tpl_ptr_pos(local_80,local_84,iVar5,*(uint8_t *)(lVar2 + 0xd2ac));
          lVar11 = lVar11 + (long)iVar9 * 200;
          dVar12 = (double)*(long *)(lVar11 + 8);
          lVar3 = *(long *)(lVar11 + 0x40);
          iVar9 = *(int *)(lVar10 + 0x54);
          lVar4 = *(long *)(lVar11 + 0x48);
          dVar13 = (double)(*(long *)(lVar11 + 0x18) << 7);
          dVar14 = log(dVar13);
          local_68 = dVar14 * dVar12 + local_68;
          dVar13 = log(dVar13 * 3.0 + (double)((lVar3 * iVar9 + 0x100 >> 9) + lVar4 * 0x80));
          local_70 = dVar13 * dVar12 + local_70;
          local_78 = dVar12 + local_78;
          lVar11 = lVar15;
        }
      }
    }
    if ((local_78 != 0.0) || (NAN(local_78))) {
      dVar12 = exp((local_68 - local_70) / local_78);
      local_bc = (int)((double)local_4 * (dVar12 / *(double *)(in_RSI + 0x4220)));
      if (local_bc < 2) {
        local_bc = 1;
      }
      local_4 = local_bc;
    }
  }
  return local_4;
}

Assistant:

int av1_get_cb_rdmult(const AV1_COMP *const cpi, MACROBLOCK *const x,
                      const BLOCK_SIZE bsize, const int mi_row,
                      const int mi_col) {
  const AV1_COMMON *const cm = &cpi->common;
  assert(IMPLIES(cpi->ppi->gf_group.size > 0,
                 cpi->gf_frame_index < cpi->ppi->gf_group.size));
  const int tpl_idx = cpi->gf_frame_index;
  int deltaq_rdmult = set_rdmult(cpi, x, -1);
  if (!av1_tpl_stats_ready(&cpi->ppi->tpl_data, tpl_idx)) return deltaq_rdmult;
  if (cm->superres_scale_denominator != SCALE_NUMERATOR) return deltaq_rdmult;
  if (cpi->oxcf.q_cfg.aq_mode != NO_AQ) return deltaq_rdmult;
  if (x->rb == 0) return deltaq_rdmult;

  TplParams *const tpl_data = &cpi->ppi->tpl_data;
  TplDepFrame *tpl_frame = &tpl_data->tpl_frame[tpl_idx];
  TplDepStats *tpl_stats = tpl_frame->tpl_stats_ptr;

  const int mi_wide = mi_size_wide[bsize];
  const int mi_high = mi_size_high[bsize];

  int tpl_stride = tpl_frame->stride;
  double intra_cost_base = 0;
  double mc_dep_cost_base = 0;
  double cbcmp_base = 0;
  const int step = 1 << tpl_data->tpl_stats_block_mis_log2;

  for (int row = mi_row; row < mi_row + mi_high; row += step) {
    for (int col = mi_col; col < mi_col + mi_wide; col += step) {
      if (row >= cm->mi_params.mi_rows || col >= cm->mi_params.mi_cols)
        continue;

      TplDepStats *this_stats = &tpl_stats[av1_tpl_ptr_pos(
          row, col, tpl_stride, tpl_data->tpl_stats_block_mis_log2)];

      double cbcmp = (double)this_stats->srcrf_dist;
      int64_t mc_dep_delta =
          RDCOST(tpl_frame->base_rdmult, this_stats->mc_dep_rate,
                 this_stats->mc_dep_dist);
      double dist_scaled = (double)(this_stats->recrf_dist << RDDIV_BITS);
      intra_cost_base += log(dist_scaled) * cbcmp;
      mc_dep_cost_base += log(3 * dist_scaled + mc_dep_delta) * cbcmp;
      cbcmp_base += cbcmp;
    }
  }

  if (cbcmp_base == 0) return deltaq_rdmult;

  double rk = exp((intra_cost_base - mc_dep_cost_base) / cbcmp_base);
  deltaq_rdmult = (int)(deltaq_rdmult * (rk / x->rb));

  return AOMMAX(deltaq_rdmult, 1);
}